

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_searcher.cc
# Opt level: O0

SearchResult __thiscall
gss::innards::HomomorphismSearcher::restarting_search
          (HomomorphismSearcher *this,HomomorphismAssignments *assignments,Domains *domains,
          unsigned_long_long *nodes,unsigned_long_long *propagations,loooong *solution_count,
          int depth,RestartsSchedule *restarts_schedule)

{
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __last;
  bool bVar1;
  undefined1 uVar2;
  byte bVar3;
  uint uVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> __first;
  uint *puVar5;
  reference piVar6;
  Domains *in_RCX;
  HomomorphismSearcher *in_RDX;
  HomomorphismSearcher *in_RSI;
  ulong __n;
  long *in_RDI;
  unsigned_long_long *in_R8;
  unsigned_long_long *in_R9;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  SVOBitset *in_stack_00000010;
  function<bool_(int,_int)> *in_stack_000001a8;
  bool in_stack_000001b6;
  bool in_stack_000001b7;
  iterator l;
  Lackey *in_stack_000001c0;
  SearchResult search_result;
  Domains new_domains;
  size_type assignments_size;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> f_end;
  iterator f_v_1;
  bool use_lackey_for_propagation;
  bool actually_hit_a_failure;
  int discrepancy_count;
  uint f_v;
  uint branch_v_end;
  vector<int,_std::allocator<int>_> branch_v;
  SVOBitset remaining;
  VertexToVertexMapping mapping_1;
  VertexToVertexMapping mapping;
  HomomorphismDomain *branch_domain;
  uint v;
  SVOBitset values;
  HomomorphismDomain *d;
  const_iterator __end2;
  const_iterator __begin2;
  Domains *__range2;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  proof_domains;
  int in_stack_fffffffffffff9b8;
  int in_stack_fffffffffffff9bc;
  SVOBitset *in_stack_fffffffffffff9c0;
  undefined4 in_stack_fffffffffffff9c8;
  int in_stack_fffffffffffff9cc;
  pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffff9d0;
  undefined4 in_stack_fffffffffffff9d8;
  uint in_stack_fffffffffffff9dc;
  SVOBitset *in_stack_fffffffffffff9e0;
  uint branch_v_end_00;
  Domains *in_stack_fffffffffffff9e8;
  HomomorphismSearcher *in_stack_fffffffffffff9f0;
  ulong in_stack_fffffffffffff9f8;
  undefined4 in_stack_fffffffffffffa00;
  SearchResult in_stack_fffffffffffffa04;
  HomomorphismSearcher *in_stack_fffffffffffffa08;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
  *in_stack_fffffffffffffa10;
  undefined7 in_stack_fffffffffffffa18;
  undefined1 in_stack_fffffffffffffa1f;
  HomomorphismSearcher *in_stack_fffffffffffffa20;
  int v_00;
  undefined7 in_stack_fffffffffffffa28;
  undefined1 in_stack_fffffffffffffa2f;
  HomomorphismSearcher *in_stack_fffffffffffffa30;
  vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_stack_fffffffffffffa48;
  Proof *in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa70;
  uint in_stack_fffffffffffffa74;
  uint in_stack_fffffffffffffa78;
  HomomorphismAssignments *in_stack_fffffffffffffa80;
  HomomorphismSearcher *in_stack_fffffffffffffa88;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_4f0 [3];
  uint local_4a4;
  int local_4a0;
  undefined1 local_49c;
  undefined4 local_498;
  undefined4 local_494;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_490;
  SearchResult local_484;
  uint local_3fc;
  int local_3f8;
  undefined1 local_3f4;
  int local_3f0;
  uint local_3ec;
  size_type local_3e8;
  undefined1 in_stack_fffffffffffffc4f;
  HomomorphismAssignments *in_stack_fffffffffffffc50;
  Domains *in_stack_fffffffffffffc58;
  undefined1 in_stack_fffffffffffffc67;
  HomomorphismSearcher *in_stack_fffffffffffffc68;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_380;
  byte local_376;
  byte local_375;
  int local_374;
  int *local_370;
  int *local_368;
  int *local_360;
  uint local_354;
  uint local_350;
  allocator<int> local_349;
  vector<int,_std::allocator<int>_> local_348 [9];
  uint local_25c;
  HomomorphismDomain *local_208;
  uint local_194;
  undefined1 local_108 [16];
  undefined8 local_f8;
  reference local_70;
  HomomorphismDomain *local_68;
  __normal_iterator<const_gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
  local_60 [4];
  loooong *in_stack_ffffffffffffffc0;
  SearchResult local_4;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
  if (bVar1) {
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x1750e9);
    bVar1 = Proof::super_extra_verbose((Proof *)0x1750f1);
    if (bVar1) {
      std::
      vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::vector((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                *)0x175107);
      local_60[0]._M_current =
           (HomomorphismDomain *)
           std::
           vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           ::begin((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                    *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      local_68 = (HomomorphismDomain *)
                 std::
                 vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                 ::end((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                        *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      while (bVar1 = __gnu_cxx::
                     operator==<const_gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                               ((__normal_iterator<const_gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                 *)in_stack_fffffffffffff9c0,
                                (__normal_iterator<const_gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                                 *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        local_70 = __gnu_cxx::
                   __normal_iterator<const_gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
                   ::operator*(local_60);
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  ((HomomorphismModel *)
                   CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                   (int)((ulong)in_stack_fffffffffffffa20 >> 0x20));
        local_108 = (undefined1  [16])0x0;
        local_f8 = 0;
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)0x1751cb);
        std::
        pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::
        pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_true>
                  (in_stack_fffffffffffff9d0,
                   (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                   (vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffff9c0);
        std::
        vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::push_back((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                     *)in_stack_fffffffffffff9c0,
                    (value_type *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        std::
        pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::~pair((pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)in_stack_fffffffffffff9c0);
        std::
        vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)in_stack_fffffffffffff9d0);
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x175228);
        SVOBitset::SVOBitset
                  (in_stack_fffffffffffff9c0,
                   (SVOBitset *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        local_194 = SVOBitset::find_first
                              ((SVOBitset *)
                               CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        while (local_194 != 0xffffffff) {
          SVOBitset::reset(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
          std::
          vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
          ::back((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                  *)in_stack_fffffffffffff9c0);
          HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                    ((HomomorphismModel *)
                     CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                     (int)((ulong)in_stack_fffffffffffffa20 >> 0x20));
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::push_back((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff9c0,
                      (value_type *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x1752ec);
          local_194 = SVOBitset::find_first
                                ((SVOBitset *)
                                 CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        }
        SVOBitset::~SVOBitset(in_stack_fffffffffffff9c0);
        __gnu_cxx::
        __normal_iterator<const_gss::innards::HomomorphismDomain_*,_std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>_>
        ::operator++(local_60);
      }
      std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1753ff);
      std::__cxx11::to_string((int)(in_stack_fffffffffffff9f8 >> 0x20));
      std::operator+((char *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff9c0);
      Proof::show_domains((Proof *)in_stack_fffffffffffffa20,
                          (string *)CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                          in_stack_fffffffffffffa10);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffff9c0);
      std::
      vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::~vector((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                 *)in_stack_fffffffffffff9d0);
    }
  }
  std::__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<gss::Timeout,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)0x1754ea
            );
  bVar1 = Timeout::should_abort((Timeout *)0x1754f2);
  if (bVar1) {
    return Aborted;
  }
  (in_RCX->
  super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  )._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&((in_RCX->
                         super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                         )._M_impl.super__Vector_impl_data._M_start)->v + 1);
  local_208 = find_branch_domain(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8);
  if (local_208 != (HomomorphismDomain *)0x0) {
    SVOBitset::SVOBitset
              (in_stack_fffffffffffff9c0,
               (SVOBitset *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    __first._M_current = (int *)(ulong)*(uint *)(*in_RDI + 0x10);
    std::allocator<int>::allocator((allocator<int> *)0x175961);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e0,
               CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8),
               (allocator_type *)in_stack_fffffffffffff9d0);
    std::allocator<int>::~allocator(&local_349);
    local_350 = 0;
    uVar4 = SVOBitset::find_first
                      ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
    local_354 = uVar4;
    while (local_354 != 0xffffffff) {
      SVOBitset::reset(in_stack_fffffffffffff9e0,in_stack_fffffffffffff9dc);
      __n = (ulong)local_350;
      in_stack_fffffffffffffa78 = local_354;
      local_350 = local_350 + 1;
      puVar5 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](local_348,__n);
      *puVar5 = in_stack_fffffffffffffa78;
      in_stack_fffffffffffffa74 =
           SVOBitset::find_first
                     ((SVOBitset *)CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
      local_354 = in_stack_fffffffffffffa74;
    }
    bVar1 = SUB81((ulong)in_stack_fffffffffffff9e0 >> 0x18,0);
    branch_v_end_00 = (uint)((ulong)in_stack_fffffffffffff9e0 >> 0x20);
    switch(*(undefined4 *)(in_RDI[1] + 0x48)) {
    case 0:
      break;
    case 1:
      softmax_shuffle(in_stack_fffffffffffffa20,
                      (vector<int,_std::allocator<int>_> *)
                      CONCAT17(in_stack_fffffffffffffa1f,in_stack_fffffffffffffa18),
                      (uint)((ulong)in_stack_fffffffffffffa10 >> 0x20));
      break;
    case 2:
      degree_sort(in_stack_fffffffffffff9f0,
                  (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e8,branch_v_end_00,
                  bVar1);
      break;
    case 3:
      degree_sort(in_stack_fffffffffffff9f0,
                  (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9e8,branch_v_end_00,
                  bVar1);
      break;
    case 4:
      local_360 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      local_370 = (int *)std::vector<int,_std::allocator<int>_>::begin
                                   ((vector<int,_std::allocator<int>_> *)
                                    CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      local_368 = (int *)__gnu_cxx::
                         __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                         operator+((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                    *)CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
                                   (difference_type)in_stack_fffffffffffff9c0);
      __last._M_current._4_4_ = uVar4;
      __last._M_current._0_4_ = in_stack_fffffffffffffa78;
      std::
      shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
                (__first,__last,
                 (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                  *)CONCAT44(in_stack_fffffffffffffa74,in_stack_fffffffffffffa70));
    }
    local_374 = 0;
    local_375 = 0;
    local_376 = 0;
    local_380._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)
                           CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    std::vector<int,_std::allocator<int>_>::begin
              ((vector<int,_std::allocator<int>_> *)
               CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
               CONCAT44(in_stack_fffffffffffff9cc,in_stack_fffffffffffff9c8),
               (difference_type)in_stack_fffffffffffff9c0);
    while( true ) {
      v_00 = (int)((ulong)in_stack_fffffffffffffa20 >> 0x20);
      bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                        ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_fffffffffffff9c0,
                         (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
      in_stack_fffffffffffffa30 = in_RDX;
      in_stack_fffffffffffffa20 = in_RSI;
      if (bVar1) {
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x175c51);
        HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                  ((HomomorphismModel *)
                   CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),v_00);
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                  (&local_380);
        HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                  ((HomomorphismModel *)
                   CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),v_00);
        Proof::guessing((Proof *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc,
                        (NamedVertex *)in_stack_fffffffffffff9c0,
                        (NamedVertex *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
                       );
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x175cfa);
        std::
        pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x175d07);
        in_stack_fffffffffffffa30 = in_RDX;
        in_stack_fffffffffffffa20 = in_RSI;
      }
      local_3e8 = std::
                  vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  ::size((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                          *)in_stack_fffffffffffffa20);
      local_3fc = local_208->v;
      piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_380);
      local_3f8 = *piVar6;
      local_3f4 = 1;
      local_3f0 = local_374;
      local_3ec = local_350;
      std::
      vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
      ::push_back((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                   *)in_stack_fffffffffffff9c0,
                  (value_type *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
      in_RDX = in_stack_fffffffffffffa30;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                (&local_380);
      copy_nonfixed_domains_and_make_assignment
                (in_stack_fffffffffffffa08,
                 (Domains *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
                 (uint)(in_stack_fffffffffffff9f8 >> 0x20),(uint)in_stack_fffffffffffff9f8);
      *in_R8 = *in_R8 + 1;
      in_stack_fffffffffffffa2f = true;
      if ((local_376 & 1) == 0) {
        in_stack_fffffffffffffa2f = *(int *)(in_RDI[1] + 0xcc) == 2;
      }
      in_RSI = in_stack_fffffffffffffa20;
      uVar2 = propagate(in_stack_fffffffffffffc68,(bool)in_stack_fffffffffffffc67,
                        in_stack_fffffffffffffc58,in_stack_fffffffffffffc50,
                        (bool)in_stack_fffffffffffffc4f);
      if (!(bool)uVar2) {
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
        if (bVar1) {
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x175eda);
          assignments_as_proof_decisions
                    (in_stack_fffffffffffffa08,
                     (HomomorphismAssignments *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          HomomorphismModel::pattern_vertex_for_proof_abi_cxx11_
                    ((HomomorphismModel *)
                     CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                     (int)((ulong)in_stack_fffffffffffffa20 >> 0x20));
          in_stack_fffffffffffffa08 = (HomomorphismSearcher *)*in_RDI;
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                    (&local_380);
          HomomorphismModel::target_vertex_for_proof_abi_cxx11_
                    ((HomomorphismModel *)
                     CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                     (int)((ulong)in_stack_fffffffffffffa20 >> 0x20));
          Proof::propagation_failure
                    ((Proof *)in_stack_fffffffffffffa30,
                     (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                     (NamedVertex *)in_stack_fffffffffffffa20,
                     (NamedVertex *)CONCAT17(uVar2,in_stack_fffffffffffffa18));
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x175f86);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)0x175f93);
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_fffffffffffff9d0);
        }
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  *)in_stack_fffffffffffff9e0,
                 CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        local_375 = 1;
        local_25c = 0xe;
        goto LAB_00176480;
      }
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
      if (bVar1) {
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x176081);
        Proof::start_level((Proof *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
      }
      in_stack_fffffffffffff9b8 = in_stack_00000008 + 1;
      in_stack_fffffffffffff9c0 = in_stack_00000010;
      in_stack_fffffffffffffa04 =
           restarting_search(in_RSI,(HomomorphismAssignments *)in_RDX,in_RCX,in_R8,in_R9,
                             in_stack_ffffffffffffffc0,unaff_retaddr,
                             (RestartsSchedule *)CONCAT44(in_stack_0000000c,in_stack_00000008));
      in_stack_fffffffffffff9f8 = (ulong)in_stack_fffffffffffffa04;
      local_484 = in_stack_fffffffffffffa04;
      switch(in_stack_fffffffffffff9f8) {
      case 0:
        local_4 = Aborted;
        local_25c = 1;
        break;
      case 2:
        local_376 = 1;
      case 1:
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
        if (bVar1) {
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x17638d);
          Proof::back_up_to_level((Proof *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
          in_stack_fffffffffffff9e0 =
               (SVOBitset *)
               std::
               __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1763b1);
          assignments_as_proof_decisions
                    (in_stack_fffffffffffffa08,
                     (HomomorphismAssignments *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          Proof::incorrect_guess
                    ((Proof *)in_stack_fffffffffffffa30,
                     (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                     SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_fffffffffffff9d0);
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x17640c);
          Proof::forget_level((Proof *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
        }
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  *)in_stack_fffffffffffff9e0,
                 CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        local_375 = 1;
      default:
switchD_00176120_default:
        local_374 = local_374 + 1;
        local_25c = 0;
        break;
      case 3:
        local_4 = Satisfiable;
        local_25c = 1;
        break;
      case 4:
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
        if (bVar1) {
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x176286);
          Proof::back_up_to_level((Proof *)in_stack_fffffffffffff9d0,in_stack_fffffffffffff9cc);
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x1762aa);
          assignments_as_proof_decisions
                    (in_stack_fffffffffffffa08,
                     (HomomorphismAssignments *)
                     CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
          Proof::incorrect_guess
                    ((Proof *)in_stack_fffffffffffffa30,
                     (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28),
                     SUB81((ulong)in_stack_fffffffffffffa20 >> 0x38,0));
          std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                    ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                     in_stack_fffffffffffff9d0);
          std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x176302);
          Proof::forget_level((Proof *)in_stack_fffffffffffff9c0,in_stack_fffffffffffff9bc);
        }
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  *)in_stack_fffffffffffff9e0,
                 CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        goto switchD_00176120_default;
      case 5:
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::resize((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                  *)in_stack_fffffffffffff9e0,
                 CONCAT44(in_stack_fffffffffffff9dc,in_stack_fffffffffffff9d8));
        local_490._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin
                              ((vector<int,_std::allocator<int>_> *)
                               CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        while (bVar1 = __gnu_cxx::operator==<int_*,_std::vector<int,_std::allocator<int>_>_>
                                 ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)in_stack_fffffffffffff9c0,
                                  (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)),
              ((bVar1 ^ 0xffU) & 1) != 0) {
          local_4a4 = local_208->v;
          piVar6 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                   operator*(&local_490);
          local_4a0 = *piVar6;
          local_49c = 1;
          local_498 = 0xfffffffe;
          local_494 = 0xfffffffe;
          std::
          vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ::push_back((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                       *)in_stack_fffffffffffff9c0,
                      (value_type *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
          post_nogood(in_stack_fffffffffffffa30,
                      (HomomorphismAssignments *)
                      CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
          std::
          vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
          ::pop_back((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                      *)0x17622e);
          __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                    (&local_490);
        }
        local_4 = Restart;
        local_25c = 1;
      }
LAB_00176480:
      std::
      vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
      ~vector((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
               *)in_stack_fffffffffffff9d0);
      if ((local_25c != 0) && (local_25c != 0xe)) goto LAB_00176633;
      in_stack_fffffffffffff9dc = local_25c;
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_380);
    }
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
    if (bVar1) {
      in_stack_fffffffffffff9d0 =
           (pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)std::
              __shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1764fa);
      assignments_as_proof_decisions
                (in_stack_fffffffffffffa08,
                 (HomomorphismAssignments *)
                 CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00));
      Proof::out_of_guesses((Proof *)in_stack_fffffffffffff9d0,local_4f0);
      std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
                ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffff9d0);
    }
    if ((local_375 & 1) != 0) {
      (**(code **)((in_stack_00000010->_data).short_data[0] + 0x10))();
    }
    bVar3 = (**(code **)((in_stack_00000010->_data).short_data[0] + 0x20))();
    if ((bVar3 & 1) == 0) {
      local_4 = Unsatisfiable;
      if ((local_376 & 1) != 0) {
        local_4 = UnsatisfiableAndBackjumpUsingLackey;
      }
      local_25c = 1;
    }
    else {
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
      if (bVar1) {
        std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1765cf);
        Proof::back_up_to_top((Proof *)in_stack_fffffffffffff9c0);
      }
      post_nogood(in_stack_fffffffffffffa30,
                  (HomomorphismAssignments *)
                  CONCAT17(in_stack_fffffffffffffa2f,in_stack_fffffffffffffa28));
      local_4 = Restart;
      local_25c = 1;
    }
LAB_00176633:
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff9d0);
    SVOBitset::~SVOBitset(in_stack_fffffffffffff9c0);
    return local_4;
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_> *
                     )0x17555e);
  if (!bVar1) goto LAB_00175723;
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x17557c)
  ;
  expand_to_full_result
            (in_stack_fffffffffffff9f0,(HomomorphismAssignments *)in_stack_fffffffffffff9e8,
             (VertexToVertexMapping *)in_stack_fffffffffffff9e0);
  std::unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>::operator->
            ((unique_ptr<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_> *)
             0x1755b3);
  std::function<bool_(int,_int)>::function((function<bool_(int,_int)> *)in_stack_fffffffffffff9c0);
  bVar1 = Lackey::check_solution
                    (in_stack_000001c0,(VertexToVertexMapping *)l._M_current,in_stack_000001b7,
                     in_stack_000001b6,in_stack_000001a8);
  std::function<bool_(int,_int)>::~function((function<bool_(int,_int)> *)0x175639);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
LAB_001756e5:
    local_25c = 0;
  }
  else if (*(uint *)(in_RDI[1] + 0xcc) < 3) {
    local_4 = Unsatisfiable;
    local_25c = 1;
  }
  else {
    if (*(uint *)(in_RDI[1] + 0xcc) != 3) goto LAB_001756e5;
    local_4 = UnsatisfiableAndBackjumpUsingLackey;
    local_25c = 1;
  }
  std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
            ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)0x1756fd)
  ;
  if (local_25c != 0) {
    return local_4;
  }
LAB_00175723:
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RDI + 6));
  if (bVar1) {
    std::__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )0x17574e);
    solution_in_proof_form_abi_cxx11_(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80);
    Proof::post_solution(in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    std::
    vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~vector((vector<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)in_stack_fffffffffffff9d0);
  }
  if ((*(byte *)(in_RDI[1] + 0x20) & 1) == 0) {
    local_4 = Satisfiable;
  }
  else {
    bVar1 = std::function<bool_(const_gss::innards::HomomorphismAssignments_&)>::operator()
                      ((function<bool_(const_gss::innards::HomomorphismAssignments_&)> *)
                       in_stack_fffffffffffff9c0,
                       (HomomorphismAssignments *)
                       CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
    if (bVar1) {
      boost::multiprecision::
      number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
      ::operator++((number<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>,_(boost::multiprecision::expression_template_option)1>
                    *)in_stack_fffffffffffff9c0);
      bVar1 = std::function::operator_cast_to_bool
                        ((function<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&)>
                          *)0x175821);
      if (bVar1) {
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   0x17583f);
        expand_to_full_result
                  (in_stack_fffffffffffff9f0,(HomomorphismAssignments *)in_stack_fffffffffffff9e8,
                   (VertexToVertexMapping *)in_stack_fffffffffffff9e0);
        bVar1 = std::
                function<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&)>
                ::operator()((function<bool_(const_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_&)>
                              *)in_stack_fffffffffffff9c0,
                             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8));
        if (!bVar1) {
          local_4 = Satisfiable;
        }
        local_25c = (uint)!bVar1;
        std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::~map
                  ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                   0x1758e7);
        if (local_25c != 0) {
          return local_4;
        }
      }
    }
    local_4 = SatisfiableButKeepGoing;
  }
  return local_4;
}

Assistant:

auto HomomorphismSearcher::restarting_search(
    HomomorphismAssignments & assignments,
    const Domains & domains,
    unsigned long long & nodes,
    unsigned long long & propagations,
    loooong & solution_count,
    int depth,
    RestartsSchedule & restarts_schedule) -> SearchResult
{
    if (proof && proof->super_extra_verbose()) {
        vector<pair<NamedVertex, vector<NamedVertex>>> proof_domains;
        for (auto & d : domains) {
            proof_domains.push_back(pair{model.pattern_vertex_for_proof(d.v), vector<NamedVertex>{}});
            auto values = d.values;
            for (auto v = values.find_first(); v != decltype(values)::npos; v = values.find_first()) {
                values.reset(v);
                proof_domains.back().second.push_back(model.target_vertex_for_proof(v));
            }
        }
        proof->show_domains("entering depth " + to_string(depth), proof_domains);
    }

    if (params.timeout->should_abort())
        return SearchResult::Aborted;

    ++nodes;

    // find ourselves a domain, or succeed if we're all assigned
    const HomomorphismDomain * branch_domain = find_branch_domain(domains);
    if (! branch_domain) {
        if (params.lackey) {
            VertexToVertexMapping mapping;
            expand_to_full_result(assignments, mapping);
            if (! params.lackey->check_solution(mapping, false, params.count_solutions, {})) {
                switch (params.propagate_using_lackey) {
                case PropagateUsingLackey::RootAndBackjump:
                    return SearchResult::UnsatisfiableAndBackjumpUsingLackey;
                case PropagateUsingLackey::Never:
                case PropagateUsingLackey::Root:
                case PropagateUsingLackey::Always:
                    return SearchResult::Unsatisfiable;
                }
            }
        }

        if (proof)
            proof->post_solution(solution_in_proof_form(assignments));

        if (params.count_solutions) {
            // we could be finding duplicate solutions, in threaded search
            if (_duplicate_solution_filterer(assignments)) {
                ++solution_count;
                if (params.enumerate_callback) {
                    VertexToVertexMapping mapping;
                    expand_to_full_result(assignments, mapping);
                    if (! params.enumerate_callback(mapping))
                        return SearchResult::Satisfiable;
                }
            }

            return SearchResult::SatisfiableButKeepGoing;
        }
        else
            return SearchResult::Satisfiable;
    }

    // pull out the remaining values in this domain for branching
    auto remaining = branch_domain->values;

    vector<int> branch_v(model.target_size);

    unsigned branch_v_end = 0;
    for (auto f_v = remaining.find_first(); f_v != decltype(remaining)::npos; f_v = remaining.find_first()) {
        remaining.reset(f_v);
        branch_v[branch_v_end++] = f_v;
    }

    switch (params.value_ordering_heuristic) {
    case ValueOrdering::None:
        break;

    case ValueOrdering::Degree:
        degree_sort(branch_v, branch_v_end, false);
        break;

    case ValueOrdering::AntiDegree:
        degree_sort(branch_v, branch_v_end, true);
        break;

    case ValueOrdering::Biased:
        softmax_shuffle(branch_v, branch_v_end);
        break;

    case ValueOrdering::Random:
        shuffle(branch_v.begin(), branch_v.begin() + branch_v_end, global_rand);
        break;
    }

    int discrepancy_count = 0;
    bool actually_hit_a_failure = false;

    // override whether we use the lackey for propagation, in case we are inside a backjump
    bool use_lackey_for_propagation = false;

    // for each value remaining...
    for (auto f_v = branch_v.begin(), f_end = branch_v.begin() + branch_v_end; f_v != f_end; ++f_v) {
        if (proof)
            proof->guessing(depth, model.pattern_vertex_for_proof(branch_domain->v), model.target_vertex_for_proof(*f_v));

        // modified in-place by appending, we can restore by shrinking
        auto assignments_size = assignments.values.size();

        // make the assignment
        assignments.values.push_back({{branch_domain->v, unsigned(*f_v)}, true, discrepancy_count, int(branch_v_end)});

        // set up new domains
        Domains new_domains = copy_nonfixed_domains_and_make_assignment(domains, branch_domain->v, *f_v);

        // propagate
        ++propagations;
        if (! propagate(false, new_domains, assignments, use_lackey_for_propagation || (params.propagate_using_lackey == PropagateUsingLackey::Always))) {
            // failure? restore assignments and go on to the next thing
            if (proof)
                proof->propagation_failure(assignments_as_proof_decisions(assignments), model.pattern_vertex_for_proof(branch_domain->v), model.target_vertex_for_proof(*f_v));

            assignments.values.resize(assignments_size);
            actually_hit_a_failure = true;

            continue;
        }

        if (proof)
            proof->start_level(depth + 2);

        // recursive search
        auto search_result = restarting_search(assignments, new_domains, nodes, propagations,
            solution_count, depth + 1, restarts_schedule);

        switch (search_result) {
        case SearchResult::Satisfiable:
            return SearchResult::Satisfiable;

        case SearchResult::Aborted:
            return SearchResult::Aborted;

        case SearchResult::Restart:
            // restore assignments before posting nogoods, it's easier
            assignments.values.resize(assignments_size);

            // post nogoods for everything we've done so far
            for (auto l = branch_v.begin(); l != f_v; ++l) {
                assignments.values.push_back({{branch_domain->v, unsigned(*l)}, true, -2, -2});
                post_nogood(assignments);
                assignments.values.pop_back();
            }

            return SearchResult::Restart;

        case SearchResult::SatisfiableButKeepGoing:
            if (proof) {
                proof->back_up_to_level(depth + 1);
                proof->incorrect_guess(assignments_as_proof_decisions(assignments), false);
                proof->forget_level(depth + 2);
            }

            // restore assignments
            assignments.values.resize(assignments_size);
            break;

        case SearchResult::UnsatisfiableAndBackjumpUsingLackey:
            use_lackey_for_propagation = true;
            [[std::fallthrough]];

        case SearchResult::Unsatisfiable:
            if (proof) {
                proof->back_up_to_level(depth + 1);
                proof->incorrect_guess(assignments_as_proof_decisions(assignments), true);
                proof->forget_level(depth + 2);
            }

            // restore assignments
            assignments.values.resize(assignments_size);
            actually_hit_a_failure = true;
            break;
        }

        ++discrepancy_count;
    }

    // no values remaining, backtrack, or possibly kick off a restart
    if (proof)
        proof->out_of_guesses(assignments_as_proof_decisions(assignments));

    if (actually_hit_a_failure)
        restarts_schedule.did_a_backtrack();

    if (restarts_schedule.should_restart()) {
        if (proof)
            proof->back_up_to_top();
        post_nogood(assignments);
        return SearchResult::Restart;
    }
    else
        return use_lackey_for_propagation ? SearchResult::UnsatisfiableAndBackjumpUsingLackey : SearchResult::Unsatisfiable;
}